

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psocks.c
# Opt level: O1

void psocks_cmdline(psocks_state *ps,int argc,char **argv)

{
  char **ppcVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  Conf *conf;
  char *pcVar7;
  long *__nptr;
  
  if (1 < argc) {
    bVar2 = true;
    bVar3 = false;
    bVar4 = false;
    do {
      iVar6 = argc + -1;
      ppcVar1 = argv + 1;
      __nptr = (long *)argv[1];
      if (((bVar2) && ((char)*__nptr == '-')) && (*(char *)((long)__nptr + 1) != '\0')) {
        iVar5 = strcmp((char *)__nptr,"--");
        if (iVar5 == 0) {
LAB_001044ad:
          bVar2 = false;
          argv = ppcVar1;
          argc = iVar6;
        }
        else {
          iVar5 = strcmp((char *)__nptr,"-g");
          if (iVar5 == 0) {
            ps->acceptall = true;
            argv = ppcVar1;
            argc = iVar6;
          }
          else {
            iVar5 = strcmp((char *)__nptr,"-d");
            if (iVar5 == 0) {
              *(byte *)&ps->log_flags = (byte)ps->log_flags | 2;
              argv = ppcVar1;
              argc = iVar6;
            }
            else {
              iVar5 = strcmp((char *)__nptr,"-f");
              if (iVar5 != 0) {
                iVar5 = strcmp((char *)__nptr,"-p");
                if (iVar5 == 0) {
                  if (ps->platform->open_pipes !=
                      (_func_PsocksDataSink_ptr_char_ptr_char_ptr_ptr_char_ptr_char_ptr_ptr *)0x0) {
                    if (argc != 2) {
                      pcVar7 = dupstr(argv[2]);
                      ps->rec_cmd = pcVar7;
                      ps->rec_dest = REC_PIPE;
                      argv = argv + 2;
                      argc = argc + -2;
                      goto LAB_001044f4;
                    }
                    goto LAB_0010464f;
                  }
                }
                else {
                  iVar5 = strcmp((char *)__nptr,"--exec");
                  if (iVar5 != 0) goto LAB_0010457c;
                  if (ps->platform->start_subcommand != (_func_void_strbuf_ptr *)0x0) {
                    bVar4 = true;
                    goto LAB_001044ad;
                  }
                  psocks_cmdline_cold_2();
LAB_0010464f:
                  psocks_cmdline_cold_3();
                }
                psocks_cmdline_cold_4();
LAB_00104659:
                psocks_cmdline_cold_1();
                conf = conf_new();
                conf_set_bool(conf,0xae,*(_Bool *)((long)__nptr + 0xc));
                pcVar7 = dupprintf("AL%d",(ulong)*(uint *)(__nptr + 1));
                conf_set_str_str(conf,0xb0,pcVar7,"D");
                safefree(pcVar7);
                portfwdmgr_config((PortFwdManager *)__nptr[2],conf);
                if (*(long *)(__nptr[7] + 0x10) != 0) {
                  (**(code **)(*__nptr + 8))();
                }
                conf_free(conf);
                return;
              }
              ps->rec_dest = REC_FILE;
              argv = ppcVar1;
              argc = iVar6;
            }
          }
        }
      }
      else if (bVar4) {
        BinarySink_put_asciz(ps->subcmd->binarysink_,(char *)__nptr);
        argv = ppcVar1;
        argc = iVar6;
      }
      else {
        if (bVar3) {
          psocks_cmdline_cold_5();
LAB_0010457c:
          iVar6 = strcmp((char *)__nptr,"--help");
          if (iVar6 == 0) {
            printf("usage: psocks [ -d ] [ -f");
            if (ps->platform->open_pipes !=
                (_func_PsocksDataSink_ptr_char_ptr_char_ptr_ptr_char_ptr_char_ptr_ptr *)0x0) {
              printf(" | -p pipe-cmd");
            }
            printf(" ] [ -g ] port-number");
            putchar(10);
            puts("where: -d           log all connection contents to standard output");
            puts("       -f           record each half-connection to a file sockin.N/sockout.N");
            if (ps->platform->open_pipes !=
                (_func_PsocksDataSink_ptr_char_ptr_char_ptr_ptr_char_ptr_char_ptr_ptr *)0x0) {
              puts("       -p pipe-cmd  pipe each half-connection to \'pipe-cmd [in|out] N\'");
            }
            puts("       -g           accept connections from anywhere, not just localhost");
            if (ps->platform->start_subcommand != (_func_void_strbuf_ptr *)0x0) {
              puts("       --exec subcmd [args...]   run command, and terminate when it exits");
            }
            puts("       port-number  listen on this port (default 1080)");
            puts("also: psocks --help      display this help text");
            exit(0);
          }
          goto LAB_00104659;
        }
        iVar5 = atoi((char *)__nptr);
        ps->listen_port = iVar5;
        bVar3 = true;
        argv = ppcVar1;
        argc = iVar6;
      }
LAB_001044f4:
    } while (1 < argc);
  }
  return;
}

Assistant:

void psocks_cmdline(psocks_state *ps, int argc, char **argv)
{
    bool doing_opts = true;
    bool accumulating_exec_args = false;
    size_t args_seen = 0;

    while (--argc > 0) {
	const char *p = *++argv;

	if (doing_opts && p[0] == '-' && p[1]) {
            if (!strcmp(p, "--")) {
                doing_opts = false;
            } else if (!strcmp(p, "-g")) {
		ps->acceptall = true;
            } else if (!strcmp(p, "-d")) {
		ps->log_flags |= LOG_DIALOGUE;
            } else if (!strcmp(p, "-f")) {
		ps->rec_dest = REC_FILE;
            } else if (!strcmp(p, "-p")) {
                if (!ps->platform->open_pipes) {
		    fprintf(stderr, "psocks: '-p' is not supported on this "
                            "platform\n");
		    exit(1);
                }
		if (--argc > 0) {
		    ps->rec_cmd = dupstr(*++argv);
		} else {
		    fprintf(stderr, "psocks: expected an argument to '-p'\n");
		    exit(1);
		}
		ps->rec_dest = REC_PIPE;
	    } else if (!strcmp(p, "--exec")) {
                if (!ps->platform->start_subcommand) {
		    fprintf(stderr, "psocks: running a subcommand is not "
                            "supported on this platform\n");
		    exit(1);
                }
                accumulating_exec_args = true;
                /* Now consume all further argv words for the
                 * subcommand, even if they look like options */
                doing_opts = false;
	    } else if (!strcmp(p, "--help")) {
                printf("usage: psocks [ -d ] [ -f");
                if (ps->platform->open_pipes)
                    printf(" | -p pipe-cmd");
                printf(" ] [ -g ] port-number");
                printf("\n");
                printf("where: -d           log all connection contents to"
                       " standard output\n");
                printf("       -f           record each half-connection to "
                       "a file sockin.N/sockout.N\n");
                if (ps->platform->open_pipes)
                    printf("       -p pipe-cmd  pipe each half-connection"
                           " to 'pipe-cmd [in|out] N'\n");
                printf("       -g           accept connections from anywhere,"
                       " not just localhost\n");
                if (ps->platform->start_subcommand)
                    printf("       --exec subcmd [args...]   run command, and "
                           "terminate when it exits\n");
                printf("       port-number  listen on this port"
                       " (default 1080)\n");
                printf("also: psocks --help      display this help text\n");
                exit(0);
            } else {
                fprintf(stderr, "psocks: unrecognised option '%s'\n", p);
                exit(1);
            }
	} else {
            if (accumulating_exec_args) {
                put_asciz(ps->subcmd, p);
            } else switch (args_seen++) {
              case 0:
                ps->listen_port = atoi(p);
                break;
              default:
                fprintf(stderr, "psocks: unexpected extra argument '%s'\n", p);
                exit(1);
                break;
            }
	}
    }
}